

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O0

void __thiscall
Js::DictionaryPropertyDescriptor<unsigned_short>::AddShadowedData
          (DictionaryPropertyDescriptor<unsigned_short> *this,unsigned_short *nextPropertyIndex,
          bool addingLetConstGlobal)

{
  code *pcVar1;
  bool bVar2;
  unsigned_short uVar3;
  undefined4 *puVar4;
  unsigned_short local_2a;
  bool addingLetConstGlobal_local;
  unsigned_short *nextPropertyIndex_local;
  DictionaryPropertyDescriptor<unsigned_short> *this_local;
  
  bVar2 = GetIsShadowed(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0xef,"(!GetIsShadowed())","!GetIsShadowed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  SetIsShadowed(this,true);
  bVar2 = GetIsAccessor(this);
  if (bVar2) {
    if (this->Data != 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xf3,"(this->Data == NoSlots)","this->Data == NoSlots");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (addingLetConstGlobal) {
      uVar3 = ::Math::PostInc<unsigned_short>(nextPropertyIndex);
      this->Data = uVar3;
    }
  }
  else if (addingLetConstGlobal) {
    this->Getter = this->Data;
    uVar3 = ::Math::PostInc<unsigned_short>(nextPropertyIndex);
    this->Data = uVar3;
  }
  else {
    uVar3 = ::Math::PostInc<unsigned_short>(nextPropertyIndex);
    this->Getter = uVar3;
  }
  this->Attributes = this->Attributes | 0x10;
  if (addingLetConstGlobal) {
    local_2a = GetDataPropertyIndex<true>(this);
  }
  else {
    local_2a = GetDataPropertyIndex<false>(this);
  }
  if (local_2a == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0x103,
                                "((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots)"
                                ,
                                "(addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void DictionaryPropertyDescriptor<TPropertyIndex>::AddShadowedData(TPropertyIndex& nextPropertyIndex, bool addingLetConstGlobal)
    {
        Assert(!GetIsShadowed());
        SetIsShadowed(true);
        if (GetIsAccessor())
        {
            Assert(this->Data == NoSlots);
            if (addingLetConstGlobal)
            {
                this->Data = ::Math::PostInc(nextPropertyIndex);
            }
        }
        else if (addingLetConstGlobal)
        {
            this->Getter = this->Data;
            this->Data = ::Math::PostInc(nextPropertyIndex);
        }
        else
        {
            this->Getter = ::Math::PostInc(nextPropertyIndex);
        }
        this->Attributes |= PropertyLetConstGlobal;
        Assert((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots);
    }